

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

void __thiscall
Eigen::SparseMatrix<float,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseMatrix<float,1,int> *this,Matrix<int,__1,_1,_0,__1,_1> *reserveSizes)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  void *pvVar3;
  CoeffReturnType piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  Index size;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (*(long *)(this + 0x20) != 0) {
    pvVar3 = malloc(*(long *)(this + 8) * 4 + 4);
    if (pvVar3 == (void *)0x0) {
      internal::throw_std_bad_alloc();
    }
    iVar7 = 0;
    lVar13 = 0;
    while (lVar13 < *(long *)(this + 8)) {
      *(int *)((long)pvVar3 + lVar13 * 4) = iVar7;
      iVar6 = *(int *)(*(long *)(this + 0x18) + 4 + lVar13 * 4) -
              (*(int *)(*(long *)(this + 0x18) + lVar13 * 4) +
              *(int *)(*(long *)(this + 0x20) + lVar13 * 4));
      piVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)reserveSizes,
                          lVar13);
      if (iVar6 < *piVar4) {
        iVar6 = *piVar4;
      }
      iVar7 = iVar6 + iVar7 + *(int *)(*(long *)(this + 0x20) + lVar13 * 4);
      lVar13 = lVar13 + 1;
    }
    *(int *)((long)pvVar3 + *(long *)(this + 8) * 4) = iVar7;
    internal::CompressedStorage<float,_int>::resize
              ((CompressedStorage<float,_int> *)(this + 0x28),(long)iVar7,0.0);
    __ptr = *(void **)(this + 0x18);
    lVar13 = *(long *)(this + 0x20);
    lVar2 = *(long *)(this + 8);
    while (lVar5 = lVar2, 0 < lVar5) {
      iVar7 = *(int *)((long)pvVar3 + lVar5 * 4 + -4);
      uVar1 = *(uint *)((long)__ptr + lVar5 * 4 + -4);
      uVar8 = (ulong)uVar1;
      lVar2 = lVar5 + -1;
      if ((int)uVar1 < iVar7) {
        lVar9 = (long)(*(int *)(lVar13 + -4 + lVar5 * 4) + -1);
        lVar11 = *(long *)(this + 0x28) + lVar9 * 4;
        lVar10 = lVar9 * 4 + *(long *)(this + 0x30);
        for (; -1 < lVar9; lVar9 = lVar9 + -1) {
          *(undefined4 *)(lVar10 + (long)iVar7 * 4) = *(undefined4 *)(lVar10 + (long)(int)uVar8 * 4)
          ;
          uVar8 = (ulong)*(int *)((long)__ptr + lVar5 * 4 + -4);
          *(undefined4 *)(lVar11 + (long)iVar7 * 4) = *(undefined4 *)(lVar11 + uVar8 * 4);
          lVar11 = lVar11 + -4;
          lVar10 = lVar10 + -4;
        }
      }
    }
    *(void **)(this + 0x18) = pvVar3;
    free(__ptr);
    return;
  }
  pvVar3 = malloc(*(long *)(this + 8) * 4);
  *(void **)(this + 0x20) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    internal::throw_std_bad_alloc();
    pvVar3 = *(void **)(this + 0x20);
  }
  iVar7 = 0;
  size = 0;
  for (lVar13 = 0; lVar13 < *(long *)(this + 8); lVar13 = lVar13 + 1) {
    *(int *)((long)pvVar3 + lVar13 * 4) = iVar7;
    piVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)reserveSizes,
                        lVar13);
    iVar7 = (iVar7 + *piVar4 + *(int *)(*(long *)(this + 0x18) + 4 + lVar13 * 4)) -
            *(int *)(*(long *)(this + 0x18) + lVar13 * 4);
    piVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)reserveSizes,
                        lVar13);
    size = size + *piVar4;
  }
  internal::CompressedStorage<float,_int>::reserve
            ((CompressedStorage<float,_int> *)(this + 0x28),size);
  lVar13 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x18);
  iVar7 = *(int *)(lVar2 + lVar13 * 4);
  lVar5 = *(long *)(this + 0x20);
  lVar9 = lVar13;
  while (0 < lVar9) {
    lVar9 = lVar9 + -1;
    uVar1 = *(uint *)(lVar2 + lVar9 * 4);
    uVar8 = (ulong)uVar1;
    iVar6 = iVar7 - uVar1;
    lVar10 = (long)(iVar6 + -1);
    lVar12 = *(long *)(this + 0x28) + lVar10 * 4;
    lVar11 = lVar10 * 4 + *(long *)(this + 0x30);
    for (; iVar7 = (int)uVar8, -1 < lVar10; lVar10 = lVar10 + -1) {
      *(undefined4 *)(lVar11 + (long)*(int *)((long)pvVar3 + lVar9 * 4) * 4) =
           *(undefined4 *)(lVar11 + (long)iVar7 * 4);
      uVar8 = (ulong)*(int *)(lVar2 + lVar9 * 4);
      *(undefined4 *)(lVar12 + (long)*(int *)((long)pvVar3 + lVar9 * 4) * 4) =
           *(undefined4 *)(lVar12 + uVar8 * 4);
      lVar12 = lVar12 + -4;
      lVar11 = lVar11 + -4;
    }
    *(undefined4 *)(lVar2 + lVar9 * 4) = *(undefined4 *)((long)pvVar3 + lVar9 * 4);
    *(int *)(lVar5 + lVar9 * 4) = iVar6;
  }
  if (lVar13 < 1) {
    iVar7 = *(int *)(lVar2 + lVar13 * 4);
  }
  else {
    iVar7 = *(int *)(lVar5 + -4 + lVar13 * 4);
    iVar6 = *(int *)(lVar2 + -4 + lVar13 * 4);
    piVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)reserveSizes,
                        lVar13 + -1);
    iVar7 = iVar7 + iVar6 + *piVar4;
    *(int *)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4) = iVar7;
  }
  internal::CompressedStorage<float,_int>::resize
            ((CompressedStorage<float,_int> *)(this + 0x28),(long)iVar7,0.0);
  return;
}

Assistant:

inline void reserveInnerVectors(const SizesType& reserveSizes)
    {
      if(isCompressed())
      {
        Index totalReserveSize = 0;
        // turn the matrix into non-compressed mode
        m_innerNonZeros = static_cast<StorageIndex*>(std::malloc(m_outerSize * sizeof(StorageIndex)));
        if (!m_innerNonZeros) internal::throw_std_bad_alloc();
        
        // temporarily use m_innerSizes to hold the new starting points.
        StorageIndex* newOuterIndex = m_innerNonZeros;
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          count += reserveSizes[j] + (m_outerIndex[j+1]-m_outerIndex[j]);
          totalReserveSize += reserveSizes[j];
        }
        m_data.reserve(totalReserveSize);
        StorageIndex previousOuterIndex = m_outerIndex[m_outerSize];
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          StorageIndex innerNNZ = previousOuterIndex - m_outerIndex[j];
          for(Index i=innerNNZ-1; i>=0; --i)
          {
            m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
            m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
          }
          previousOuterIndex = m_outerIndex[j];
          m_outerIndex[j] = newOuterIndex[j];
          m_innerNonZeros[j] = innerNNZ;
        }
        if(m_outerSize>0)
          m_outerIndex[m_outerSize] = m_outerIndex[m_outerSize-1] + m_innerNonZeros[m_outerSize-1] + reserveSizes[m_outerSize-1];
        
        m_data.resize(m_outerIndex[m_outerSize]);
      }
      else
      {
        StorageIndex* newOuterIndex = static_cast<StorageIndex*>(std::malloc((m_outerSize+1)*sizeof(StorageIndex)));
        if (!newOuterIndex) internal::throw_std_bad_alloc();
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          StorageIndex alreadyReserved = (m_outerIndex[j+1]-m_outerIndex[j]) - m_innerNonZeros[j];
          StorageIndex toReserve = std::max<StorageIndex>(reserveSizes[j], alreadyReserved);
          count += toReserve + m_innerNonZeros[j];
        }
        newOuterIndex[m_outerSize] = count;
        
        m_data.resize(count);
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          Index offset = newOuterIndex[j] - m_outerIndex[j];
          if(offset>0)
          {
            StorageIndex innerNNZ = m_innerNonZeros[j];
            for(Index i=innerNNZ-1; i>=0; --i)
            {
              m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
              m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
            }
          }
        }
        
        std::swap(m_outerIndex, newOuterIndex);
        std::free(newOuterIndex);
      }
      
    }